

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t aa64_dczid_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  CPAccessResult CVar1;
  ArchCPU_conflict2 *pAVar2;
  uint local_24;
  int dzp_bit;
  ARMCPU_conflict1 *cpu;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  pAVar2 = env_archcpu(env);
  local_24 = 0x10;
  CVar1 = aa64_zva_access(env,(ARMCPRegInfo_conflict *)0x0,false);
  if (CVar1 == CP_ACCESS_OK) {
    local_24 = 0;
  }
  return (ulong)(pAVar2->dcz_blocksize | local_24);
}

Assistant:

static uint64_t aa64_dczid_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);
    int dzp_bit = 1 << 4;

    /* DZP indicates whether DC ZVA access is allowed */
    if (aa64_zva_access(env, NULL, false) == CP_ACCESS_OK) {
        dzp_bit = 0;
    }
    return cpu->dcz_blocksize | dzp_bit;
}